

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::FunctionBreakpoint>::construct
          (BasicTypeInfo<dap::FunctionBreakpoint> *this,void *ptr)

{
  *(undefined8 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x28) = 0;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  *(undefined8 *)((long)ptr + 0x38) = 0;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  *(undefined8 *)((long)ptr + 0x58) = 0;
  *(undefined8 *)((long)ptr + 0x60) = 0;
  *(undefined8 *)((long)ptr + 0x68) = 0;
  *(undefined8 *)((long)ptr + 0x40) = 0;
  *(undefined8 *)((long)ptr + 0x48) = 0;
  *(undefined8 *)((long)ptr + 0x10) = 0;
  *(undefined8 *)((long)ptr + 0x18) = 0;
  *(long *)ptr = (long)ptr + 0x10;
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(long *)((long)ptr + 0x28) = (long)ptr + 0x38;
  *(undefined1 *)((long)ptr + 0x38) = 0;
  *(long *)((long)ptr + 0x50) = (long)ptr + 0x60;
  *(undefined1 *)((long)ptr + 0x60) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }